

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

void __thiscall dg::llvmdg::legacy::Function::Function(Function *this)

{
  value_type pBVar1;
  value_type *in_RDI;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *unaff_retaddr;
  BasicBlock *in_stack_ffffffffffffffe8;
  undefined1 in_stack_fffffffffffffff0;
  undefined7 in_stack_fffffffffffffff1;
  value_type *__x;
  
  *in_RDI = (value_type)0x0;
  __x = in_RDI;
  pBVar1 = (value_type)operator_new(0x118);
  Block::Block((Block *)CONCAT71(in_stack_fffffffffffffff1,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI[1] = pBVar1;
  std::
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::set((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
         *)0x21adac);
  std::
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::insert(unaff_retaddr,__x);
  return;
}

Assistant:

Function::Function() : lastBlock(new Block(nullptr)) {
    blocks.insert(lastBlock);
}